

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Print.H
# Opt level: O0

void __thiscall amrex::AllPrint::AllPrint(AllPrint *this,ostream *os_)

{
  int in_stack_0000001c;
  Print *in_stack_00000020;
  
  Print::Print(in_stack_00000020,in_stack_0000001c,(ostream *)this);
  return;
}

Assistant:

explicit AllPrint (std::ostream& os_ = amrex::OutStream())
            : Print(Print::AllProcs, os_)
            {}